

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.h
# Opt level: O0

uint32_t mp_decode_array_slowpath(uint8_t c,char **data)

{
  uint16_t uVar1;
  uint32_t size;
  char **data_local;
  uint8_t c_local;
  
  if ((c & 1) == 0) {
    uVar1 = mp_load_u16(data);
    data_local._4_4_ = (uint32_t)uVar1;
  }
  else {
    if ((c & 1) != 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/msgpuck.h"
                    ,0x7ab,"uint32_t mp_decode_array_slowpath(uint8_t, const char **)");
    }
    data_local._4_4_ = mp_load_u32(data);
  }
  return data_local._4_4_;
}

Assistant:

MP_IMPL uint32_t
mp_decode_array_slowpath(uint8_t c, const char **data)
{
	uint32_t size;
	switch (c & 0x1) {
	case 0xdc & 0x1:
		size = mp_load_u16(data);
		return size;
	case 0xdd & 0x1:
		size = mp_load_u32(data);
		return size;
	default:
		mp_unreachable();
	}
}